

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O0

int AF_A_ShutdownPhoenixPL2
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *actor;
  DObject *this;
  player_t *ppVar1;
  AWeapon *this_00;
  bool bVar2;
  bool local_66;
  bool local_63;
  AWeapon *weapon;
  player_t *player;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                  ,0x543,
                  "int AF_A_ShutdownPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    actor = (AActor *)(param->field_0).field_1.a;
    local_63 = true;
    if (actor != (AActor *)0x0) {
      local_63 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
    }
    if (local_63 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                    ,0x543,
                    "int AF_A_ShutdownPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
        bVar2 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x543,
                      "int AF_A_ShutdownPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_66 = true;
      if (this != (DObject *)0x0) {
        local_66 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_66 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x543,
                      "int AF_A_ShutdownPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
        bVar2 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                      ,0x543,
                      "int AF_A_ShutdownPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    ppVar1 = actor->player;
    if (ppVar1 != (player_t *)0x0) {
      S_StopSound(actor,1);
      this_00 = ppVar1->ReadyWeapon;
      if (this_00 != (AWeapon *)0x0) {
        AWeapon::DepleteAmmo(this_00,(bool)(this_00->bAltFire & 1),true,-1);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x543,
                "int AF_A_ShutdownPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ShutdownPhoenixPL2)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	S_StopSound (self, CHAN_WEAPON);
	AWeapon *weapon = player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}
	return 0;
}